

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
CLOptions::GetShortOpts
          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,CLOptions *this,string *short_opts)

{
  pointer pcVar1;
  long lVar2;
  CLOptions *pCVar3;
  long *plVar4;
  undefined8 *puVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  _Rb_tree_header *p_Var9;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *short_to_long;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  CLOptions *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_80[0] = local_70;
  local_60 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"h","");
  pcVar1 = (this->version_opt).
           super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .value._M_dataplus._M_p;
  local_58 = this;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,
             pcVar1 + (this->version_opt).
                      super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .value._M_string_length);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_80);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_90 = *plVar8;
    lStack_88 = plVar4[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar8;
    local_a0 = (long *)*plVar4;
  }
  local_98 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)short_opts,(string *)&local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  pCVar3 = local_58;
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  p_Var9 = &(local_60->_M_t)._M_impl.super__Rb_tree_header;
  (local_60->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (local_60->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (local_60->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var9->_M_header;
  (local_60->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var9->_M_header;
  (local_60->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = (pCVar3->params_bools)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(pCVar3->params_bools)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var9) {
    do {
      if ('\n' < *(char *)(*(long *)(p_Var7 + 2) + 0x28)) {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct((ulong)local_80,'\x01');
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_80);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_90 = *plVar4;
          lStack_88 = puVar5[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar4;
          local_a0 = (long *)*puVar5;
        }
        local_98 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)short_opts,(ulong)local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_80[0] != local_70) {
          operator_delete(local_80[0]);
        }
        lVar2 = *(long *)(*(long *)(p_Var7 + 2) + 8);
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,lVar2,*(long *)(*(long *)(p_Var7 + 2) + 0x10) + lVar2);
        local_80[0] = (undefined1 *)
                      CONCAT44(local_80[0]._4_4_,(int)*(char *)(*(long *)(p_Var7 + 2) + 0x28));
        pmVar6 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,(key_type *)local_80);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var9);
  }
  p_Var7 = (local_58->params_doubles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(local_58->params_doubles)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var9) {
    do {
      if ('\n' < *(char *)(*(long *)(p_Var7 + 2) + 0x28)) {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct((ulong)local_80,'\x01');
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_80);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_90 = *plVar4;
          lStack_88 = puVar5[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar4;
          local_a0 = (long *)*puVar5;
        }
        local_98 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)short_opts,(ulong)local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_80[0] != local_70) {
          operator_delete(local_80[0]);
        }
        lVar2 = *(long *)(*(long *)(p_Var7 + 2) + 8);
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,lVar2,*(long *)(*(long *)(p_Var7 + 2) + 0x10) + lVar2);
        local_80[0] = (undefined1 *)
                      CONCAT44(local_80[0]._4_4_,(int)*(char *)(*(long *)(p_Var7 + 2) + 0x28));
        pmVar6 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,(key_type *)local_80);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var9);
  }
  p_Var7 = (local_58->params_ints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(local_58->params_ints)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var9) {
    do {
      if ('\n' < *(char *)(*(long *)(p_Var7 + 2) + 0x28)) {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct((ulong)local_80,'\x01');
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_80);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_90 = *plVar4;
          lStack_88 = puVar5[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar4;
          local_a0 = (long *)*puVar5;
        }
        local_98 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)short_opts,(ulong)local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_80[0] != local_70) {
          operator_delete(local_80[0]);
        }
        lVar2 = *(long *)(*(long *)(p_Var7 + 2) + 8);
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,lVar2,*(long *)(*(long *)(p_Var7 + 2) + 0x10) + lVar2);
        local_80[0] = (undefined1 *)
                      CONCAT44(local_80[0]._4_4_,(int)*(char *)(*(long *)(p_Var7 + 2) + 0x28));
        pmVar6 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,(key_type *)local_80);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var9);
  }
  p_Var7 = (local_58->params_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(local_58->params_strings)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var9) {
    do {
      if ('\n' < *(char *)(*(long *)(p_Var7 + 2) + 0x28)) {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct((ulong)local_80,'\x01');
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_80);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_90 = *plVar4;
          lStack_88 = puVar5[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar4;
          local_a0 = (long *)*puVar5;
        }
        local_98 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)short_opts,(ulong)local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_80[0] != local_70) {
          operator_delete(local_80[0]);
        }
        lVar2 = *(long *)(*(long *)(p_Var7 + 2) + 8);
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,lVar2,*(long *)(*(long *)(p_Var7 + 2) + 0x10) + lVar2);
        local_80[0] = (undefined1 *)
                      CONCAT44(local_80[0]._4_4_,(int)*(char *)(*(long *)(p_Var7 + 2) + 0x28));
        pmVar6 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,(key_type *)local_80);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var9);
  }
  return local_60;
}

Assistant:

std::map<int, std::string> CLOptions::GetShortOpts(std::string& short_opts)
{
    // Fill with the default help and version information
    short_opts = std::string("h") + (version_opt.getValue().empty() ? "" : "v") ;
    
    // Create a map of "short" -> "long" variables
    std::map<int,std::string> short_to_long ;
    
    std::map<std::string, CLBool*>::iterator bool_itr ;
    for (bool_itr=params_bools.begin(); bool_itr!=params_bools.end(); ++bool_itr) {
        if (bool_itr->second->getShortParamName() > 10) {
            short_opts += bool_itr->second->getShortParamNameStr()+":";
            short_to_long[bool_itr->second->getShortParamName()] = bool_itr->second->getParamName() ;
        }
    }
    // DOUBLES
    std::map<std::string, CLDouble*>::iterator dbl_itr ;
    for (dbl_itr=params_doubles.begin(); dbl_itr!=params_doubles.end(); ++dbl_itr) {
        if (dbl_itr->second->getShortParamName() > 10) {
            short_opts += dbl_itr->second->getShortParamNameStr()+":";
            short_to_long[dbl_itr->second->getShortParamName()] = dbl_itr->second->getParamName() ;
        }
    }
    // INTEGERS
    std::map<std::string, CLInt*>::iterator int_itr ;
    for (int_itr=params_ints.begin(); int_itr!=params_ints.end(); ++int_itr) {
        if (int_itr->second->getShortParamName() > 10) {
            short_opts += int_itr->second->getShortParamNameStr()+":";
            short_to_long[int_itr->second->getShortParamName()] = int_itr->second->getParamName() ;
        }
    }
    // STRINGS
    std::map<std::string, CLString*>::iterator str_itr ;
    for (str_itr=params_strings.begin(); str_itr!=params_strings.end(); ++str_itr) {
        if (str_itr->second->getShortParamName() > 10) {
            short_opts += str_itr->second->getShortParamNameStr()+":";
            short_to_long[str_itr->second->getShortParamName()] = str_itr->second->getParamName() ;
        }
    }
    
    return short_to_long ;
}